

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpComms::TcpComms(TcpComms *this)

{
  NetworkCommsInterface::NetworkCommsInterface(&this->super_NetworkCommsInterface,TCP,dual);
  (this->super_NetworkCommsInterface).super_CommsInterface._vptr_CommsInterface =
       (_func_int **)&PTR__TcpComms_004c5f68;
  this->reuse_address = false;
  (this->encryption_config)._M_dataplus._M_p = (pointer)&(this->encryption_config).field_2;
  (this->encryption_config)._M_string_length = 0;
  (this->encryption_config).field_2._M_local_buf[0] = '\0';
  (this->rxMessageQueue).m_pushLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rxMessageQueue).m_pushLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->rxMessageQueue).m_pushLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->rxMessageQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rxMessageQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rxMessageQueue).m_pullLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rxMessageQueue).m_pullLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->rxMessageQueue).m_pullLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->rxMessageQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rxMessageQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rxMessageQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rxMessageQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rxMessageQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rxMessageQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rxMessageQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rxMessageQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rxMessageQueue).queueEmptyFlag._M_base._M_i = true;
  std::condition_variable::condition_variable(&(this->rxMessageQueue).condition);
  return;
}

Assistant:

TcpComms::TcpComms() noexcept: NetworkCommsInterface(gmlc::networking::InterfaceTypes::TCP) {}